

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CMU462::OSDText::draw_line(OSDText *this,OSDLine *line)

{
  FT_GlyphSlot_conflict pFVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  GLuint tex;
  point box [4];
  
  FT_Set_Pixel_Sizes(*this->face,0,(int)line->size);
  (*__glewUniform4fv)(this->uniform_color,1,&(line->color).r);
  pFVar1 = (*this->face)->glyph;
  (*__glewActiveTexture)(0x84c0);
  glGenTextures(1,&tex);
  glBindTexture(0xde1,tex);
  (*__glewUniform1i)(this->uniform_tex,0);
  glPixelStorei(0xcf5,1);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  (*__glewEnableVertexAttribArray)(this->attribute_coord);
  (*__glewBindBuffer)(0x8892,this->vbo);
  (*__glewVertexAttribPointer)(this->attribute_coord,4,0x1406,'\0',0,(void *)0x0);
  pcVar4 = (line->text)._M_dataplus._M_p;
  cVar2 = *pcVar4;
  if (cVar2 != '\0') {
    do {
      pcVar4 = pcVar4 + 1;
      iVar3 = FT_Load_Char(*this->face,(long)cVar2,4);
      if (iVar3 == 0) {
        glTexImage2D(0xde1,0,0x1906,(pFVar1->bitmap).width,(pFVar1->bitmap).rows,0,0x1906,0x1401,
                     (pFVar1->bitmap).buffer);
        box[0].x = (float)pFVar1->bitmap_left * this->sx + line->x;
        box[0].y = -(-(float)pFVar1->bitmap_top * this->sy - line->y);
        box[0].s = 0.0;
        box[0].t = 0.0;
        box[1].x = (float)(pFVar1->bitmap).width * this->sx + box[0].x;
        box[1].s = 1.0;
        box[1].t = 0.0;
        box[2].y = box[0].y - (float)(pFVar1->bitmap).rows * this->sy;
        box[2].s = 0.0;
        box[2].t = 1.0;
        box[3].s = 1.0;
        box[3].t = 1.0;
        box[1].y = box[0].y;
        box[2].x = box[0].x;
        box[3].x = box[1].x;
        box[3].y = box[2].y;
        (*__glewBufferData)(0x8892,0x40,box,0x88e8);
        glDrawArrays(5,0,4);
        line->x = (float)((pFVar1->advance).x >> 6) * this->sx + line->x;
        line->y = (float)((pFVar1->advance).y >> 6) * this->sy + line->y;
      }
      cVar2 = *pcVar4;
    } while (cVar2 != '\0');
  }
  (*__glewDisableVertexAttribArray)(this->attribute_coord);
  glDeleteTextures(1,&tex);
  return;
}

Assistant:

void OSDText::draw_line(OSDLine line) {

  // set font size
  FT_Set_Pixel_Sizes(*face, 0, line.size);

  // set font color
  glUniform4fv(uniform_color, 1, (GLfloat*) &line.color);

  // get glyph
  const char *p;
  FT_GlyphSlot g = (*face)->glyph;

  // gen texture
  GLuint tex;
  glActiveTexture(GL_TEXTURE0);
  glGenTextures(1, &tex);
  glBindTexture(GL_TEXTURE_2D, tex);
  glUniform1i(uniform_tex, 0);

  // require 1 byte alignment when uploading texture data
  glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

  // clamping to edges is important to prevent artifacts when scaling
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

  // linear filtering usually looks best for text
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  // set up the VBO for our vertex data
  glEnableVertexAttribArray(attribute_coord);
  glBindBuffer(GL_ARRAY_BUFFER, vbo);
  glVertexAttribPointer(attribute_coord, 4, GL_FLOAT, GL_FALSE, 0, 0);

  // loop through all characters
  const char* text = line.text.c_str();
  for (p = text; *p; p++) {

    // Try to load and render the character
    if (FT_Load_Char(*face, *p, FT_LOAD_RENDER)) continue;

    // Upload the glyph bitmap as an alpha texture
    glTexImage2D(GL_TEXTURE_2D,
                 0, GL_ALPHA, g->bitmap.width, g->bitmap.rows,
                 0, GL_ALPHA, GL_UNSIGNED_BYTE, g->bitmap.buffer);

    // calculate the vertex and texture coordinates
    float x2 =  line.x + g->bitmap_left * sx;
    float y2 = -line.y - g->bitmap_top  * sy;
    float w = g->bitmap.width * sx;
    float h = g->bitmap.rows  * sy;

    point box[4] = {
      {x2, -y2, 0, 0},
      {x2 + w, -y2, 1, 0},
      {x2, -y2 - h, 0, 1},
      {x2 + w, -y2 - h, 1, 1},
    };

    // draw the character to screen
    glBufferData(GL_ARRAY_BUFFER, sizeof box, box, GL_DYNAMIC_DRAW);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // Advance the cursor to the start of the next character
    line.x += (g->advance.x >> 6) * sx;
    line.y += (g->advance.y >> 6) * sy;
  }

  glDisableVertexAttribArray(attribute_coord);
  glDeleteTextures(1, &tex);

}